

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

VkSamplerCreateInfo * __thiscall
vkt::pipeline::anon_unknown_0::SamplerAddressModesTest::getSamplerCreateInfo
          (VkSamplerCreateInfo *__return_storage_ptr__,SamplerAddressModesTest *this)

{
  VkSamplerCreateInfo *samplerParams;
  SamplerAddressModesTest *this_local;
  
  SamplerTest::getSamplerCreateInfo(__return_storage_ptr__,&this->super_SamplerTest);
  __return_storage_ptr__->addressModeU =
       *(VkSamplerAddressMode *)&(this->super_SamplerTest).field_0x124;
  __return_storage_ptr__->addressModeV = this->m_addressV;
  __return_storage_ptr__->addressModeW = this->m_addressW;
  __return_storage_ptr__->borderColor = this->m_borderColor;
  return __return_storage_ptr__;
}

Assistant:

VkSamplerCreateInfo SamplerAddressModesTest::getSamplerCreateInfo (void) const
{
	VkSamplerCreateInfo samplerParams = SamplerTest::getSamplerCreateInfo();
	samplerParams.addressModeU	= m_addressU;
	samplerParams.addressModeV	= m_addressV;
	samplerParams.addressModeW	= m_addressW;
	samplerParams.borderColor	= m_borderColor;

	return samplerParams;
}